

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall<wasm::Call>
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Call *curr,
          Type params)

{
  Expression **ppEVar1;
  size_t sVar2;
  Type *pTVar3;
  long lVar4;
  ulong uVar5;
  Iterator local_50;
  Type local_40;
  Type params_local;
  
  local_40.id = params.id;
  params_local.id = (uintptr_t)this;
  sVar2 = wasm::Type::size(&local_40);
  if (sVar2 != (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements) {
    __assert_fail("params.size() == curr->operands.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0xa2,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall(T *, Type) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector, T = wasm::Call]"
                 );
  }
  sVar2 = wasm::Type::size(&local_40);
  if (sVar2 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar5) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = (curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           &local_40;
      local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar5;
      pTVar3 = wasm::Type::Iterator::operator*(&local_50);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)params_local.id,(Expression **)((long)ppEVar1 + lVar4),
                 (Type)pTVar3->id);
      uVar5 = uVar5 + 1;
      sVar2 = wasm::Type::size(&local_40);
      lVar4 = lVar4 + 8;
    } while (uVar5 < sVar2);
  }
  return;
}

Assistant:

void handleCall(T* curr, Type params) {
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
  }